

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMK.cpp
# Opt level: O2

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::DMK::get_track_at_position(DMK *this,Address address)

{
  FileHolder *this_00;
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  pointer pPVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Address AVar6;
  uint16_t uVar7;
  long lVar8;
  size_t in_RCX;
  Address in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer __old_p_1;
  pointer pPVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  pointer __old_p;
  bool bVar18;
  shared_ptr<Storage::Disk::Track> sVar19;
  long lStack_140;
  byte local_129;
  uint8_t header [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_120 [2];
  Address local_110;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> segments;
  vector<unsigned_char,_std::allocator<unsigned_char>_> track;
  uint16_t idam_locations [64];
  
  this_00 = (FileHolder *)((long)address + 8);
  local_110 = address;
  lVar8 = get_file_offset_for_position((DMK *)address,in_RDX);
  lVar11 = 0;
  FileHolder::seek(this_00,lVar8,0);
  lVar8 = 0x40;
  while (AVar6 = local_110, bVar18 = lVar8 != 0, lVar8 = lVar8 + -1, bVar18) {
    uVar7 = FileHolder::get16le(this_00);
    idam_locations[lVar11] = uVar7;
    lVar11 = (lVar11 + 1) - (ulong)((uVar7 & 0x7f80) == 0);
  }
  FileHolder::read((FileHolder *)&track,(int)this_00,
                   (void *)(*(long *)((long)local_110 + 0x100) + -0x80),in_RCX);
  local_129 = *(byte *)((long)AVar6 + 0x108);
  segments.super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  segments.super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  segments.super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::emplace_back<>
            (&segments);
  local_129 = local_129 ^ 1;
  anon_unknown.dwarf_10128a1::new_encoder
            ((anon_unknown_dwarf_10128a1 *)header,
             segments.
             super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1,(bool)local_129);
  uVar15 = *(long *)((long)local_110 + 0x100) - 0x80;
  lVar8 = 0;
  uVar17 = 0;
  pPVar9 = _header;
  while (uVar17 < uVar15) {
    uVar13 = uVar15;
    if (lVar8 != lVar11) {
      uVar13 = (ulong)(idam_locations[lVar8] & 0x7fff) - 0x80;
    }
    uVar14 = uVar17;
    if (((local_129 & 1) == 0) && (*(char *)((long)local_110 + 0x108) == '\0')) {
      std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
      emplace_back<>(&segments);
      anon_unknown.dwarf_10128a1::new_encoder
                ((anon_unknown_dwarf_10128a1 *)header,
                 segments.
                 super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,true);
      pPVar4 = _header;
      _header = (pointer)0x0;
      if ((pPVar9 != (pointer)0x0) &&
         ((**(code **)((long)pPVar9->length_of_a_bit + 8))(pPVar9), _header != (pointer)0x0)) {
        (**(code **)((long)_header->length_of_a_bit + 8))();
      }
      local_129 = 1;
      pPVar9 = pPVar4;
    }
    for (; uVar14 < uVar13; uVar14 = uVar14 + 1) {
      (**(code **)((long)pPVar9->length_of_a_bit + 0x18))
                (pPVar9,track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar14],0);
    }
    if (uVar13 == uVar15) break;
    uVar3 = idam_locations[lVar8];
    if (uVar3 >> 0xf != (ushort)(local_129 & 1)) {
      std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
      emplace_back<>(&segments);
      local_129 = (byte)(uVar3 >> 8);
      anon_unknown.dwarf_10128a1::new_encoder
                ((anon_unknown_dwarf_10128a1 *)header,
                 segments.
                 super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,(bool)(local_129 >> 7));
      pPVar4 = _header;
      _header = (pointer)0x0;
      if ((pPVar9 != (pointer)0x0) &&
         ((**(code **)((long)pPVar9->length_of_a_bit + 8))(pPVar9), _header != (pointer)0x0)) {
        (**(code **)((long)_header->length_of_a_bit + 8))();
      }
      local_129 = local_129 >> 7;
      pPVar9 = pPVar4;
    }
    bVar1 = *(byte *)((long)local_110 + 0x108);
    (**(code **)((long)pPVar9->length_of_a_bit + 0x28))(pPVar9);
    lVar10 = 2 - (ulong)((bVar1 | local_129) & 1);
    uVar17 = uVar14 + lVar10 * 2;
    for (lVar16 = 0; uVar14 = lVar10 + uVar14, lVar16 != 6; lVar16 = lVar16 + 1) {
      (**(code **)((long)pPVar9->length_of_a_bit + 0x18))
                (pPVar9,track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar14],0);
      header[lVar16] =
           track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar14];
      uVar17 = uVar17 + lVar10;
    }
    while( true ) {
      uVar2 = track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14];
      if (uVar2 == 0xfb) break;
      if (uVar2 == 0xf8) {
        lStack_140 = 0x38;
        goto LAB_003d4fe8;
      }
      uVar14 = uVar14 + lVar10;
      uVar17 = uVar17 + lVar10;
      (**(code **)((long)pPVar9->length_of_a_bit + 0x18))(pPVar9,uVar2,0);
    }
    lStack_140 = 0x30;
LAB_003d4fe8:
    (**(code **)((long)pPVar9->length_of_a_bit + lStack_140))(pPVar9);
    (**(code **)((long)pPVar9->length_of_a_bit + 0x30))(pPVar9);
    uVar12 = 0x80 << (header[3] & 0x1f) | 2;
    while (bVar18 = uVar12 != 0, uVar12 = uVar12 - 1, bVar18) {
      (**(code **)((long)pPVar9->length_of_a_bit + 0x18))
                (pPVar9,track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar17],0);
      uVar17 = uVar17 + lVar10;
    }
    lVar8 = lVar8 + 1;
  }
  std::
  make_shared<Storage::Disk::PCMTrack,std::vector<Storage::Disk::PCMSegment,std::allocator<Storage::Disk::PCMSegment>>&>
            ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)header
            );
  _Var5._M_pi = a_Stack_120[0]._M_pi;
  a_Stack_120[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)_header;
  (this->file_).file_ = (FILE *)_Var5._M_pi;
  _header = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_120);
  if (pPVar9 != (pointer)0x0) {
    (**(code **)((long)pPVar9->length_of_a_bit + 8))(pPVar9);
  }
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::~vector
            (&segments);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  sVar19.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar19.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar19.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<::Storage::Disk::Track> DMK::get_track_at_position(::Storage::Disk::Track::Address address) {
	file_.seek(get_file_offset_for_position(address), SEEK_SET);

	// Read the IDAM table.
	uint16_t idam_locations[64];
	std::size_t idam_count = 0;
	for(std::size_t c = 0; c < sizeof(idam_locations) / sizeof(*idam_locations); ++c) {
		idam_locations[idam_count] = file_.get16le();
		if((idam_locations[idam_count] & 0x7fff) >= 128) {
			idam_count++;
		}
	}

	// Grab the rest of the track.
	std::vector<uint8_t> track = file_.read(size_t(track_length_ - 0x80));

	// Default to outputting double density unless the disk doesn't support it.
	bool is_double_density = !is_purely_single_density_;
	std::vector<PCMSegment> segments;
	std::unique_ptr<Encodings::MFM::Encoder> encoder;
	segments.emplace_back();
	encoder = new_encoder(segments.back(), is_double_density);

	std::size_t idam_pointer = 0;

	const std::size_t track_length = size_t(track_length_) - 0x80;
	std::size_t track_pointer = 0;
	while(track_pointer < track_length) {
		// Determine bytes left until next IDAM.
		std::size_t destination;
		if(idam_pointer != idam_count) {
			destination = (idam_locations[idam_pointer] & 0x7fff) - 0x80;
		} else {
			destination = track_length;
		}

		// Output every intermediate byte.
		if(!is_double_density && !is_purely_single_density_) {
			is_double_density = true;
			segments.emplace_back();
			encoder = new_encoder(segments.back(), is_double_density);
		}
		while(track_pointer < destination) {
			encoder->add_byte(track[track_pointer]);
			track_pointer++;
		}

		// Exit now if that's it.
		if(destination == track_length) break;

		// Being now located at the IDAM, check for a change of encoding.
		bool next_is_double_density = !!(idam_locations[idam_pointer] & 0x8000);
		if(next_is_double_density != is_double_density) {
			is_double_density = next_is_double_density;
			segments.emplace_back();
			encoder = new_encoder(segments.back(), is_double_density);
		}

		// Now at the IDAM, which will always be an FE regardless of FM/MFM encoding,
		// presumably through misunderstanding of the designer? Write out a real IDAM
		// for the current density, then the rest of the ID: four bytes for the address
		// plus two for the CRC. Keep a copy of the header while we're here, so that the
		// size of the sector is known momentarily.
		std::size_t step_rate = (!is_double_density && !is_purely_single_density_) ? 2 : 1;
		encoder->add_ID_address_mark();
		uint8_t header[6];
		for(int c = 0; c < 6; ++c) {
			track_pointer += step_rate;
			encoder->add_byte(track[track_pointer]);
			header[c] = track[track_pointer];
		}
		track_pointer += step_rate;

		// Now write out as many bytes as are found prior to an FB or F8 (same comment as
		// above: those are the FM-esque marks, but it seems as though transcription to MFM
		// is implicit).
		while(true) {
			uint8_t next_byte = track[track_pointer];
			track_pointer += step_rate;
			if(next_byte == 0xfb || next_byte == 0xf8) {
				// Write a data or deleted data address mark.
				if(next_byte == 0xfb) encoder->add_data_address_mark();
				else encoder->add_deleted_data_address_mark();
				break;
			}
			encoder->add_byte(next_byte);
		}

		// Now write out a data mark (the file format appears to leave these implicit?),
		// then the sector contents plus the CRC.
		encoder->add_data_address_mark();
		int sector_size = 2 + (128 << header[3]);
		while(sector_size--) {
			encoder->add_byte(track[track_pointer]);
			track_pointer += step_rate;
		}

		idam_pointer++;
	}

	return std::make_shared<PCMTrack>(segments);
}